

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceMethod
          (Parser *this,MethodDescriptorProto *method,LocationRecorder *method_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *psVar2;
  MethodOptions *mutable_options;
  string_view local_190;
  string_view local_180;
  string_view local_170;
  undefined1 local_160 [8];
  LocationRecorder location_3;
  undefined1 local_138 [8];
  LocationRecorder location_4;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  undefined1 local_e0 [8];
  LocationRecorder location_1;
  undefined1 local_b8 [8];
  LocationRecorder location_2;
  string_view local_90;
  uint local_7c;
  ErrorMaker local_78 [2];
  undefined1 local_58 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *method_location_local;
  MethodDescriptorProto *method_local;
  Parser *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,"rpc");
  bVar1 = Consume(this,stack0xffffffffffffffc0);
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_58,method_location,1);
    LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_58,&method->super_Message,NAME)
    ;
    psVar2 = MethodDescriptorProto::mutable_name_abi_cxx11_(method);
    ErrorMaker::ErrorMaker(local_78,"Expected method name.");
    bVar1 = ConsumeIdentifier(this,psVar2,local_78[0]);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    local_7c = (uint)!bVar1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
    if (local_7c == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"(");
      bVar1 = Consume(this,local_90);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&location_2.location_,
                   "stream");
        bVar1 = LookingAt(this,stack0xffffffffffffff60);
        if (bVar1) {
          LocationRecorder::LocationRecorder((LocationRecorder *)local_b8,method_location,5);
          LocationRecorder::RecordLegacyLocation
                    ((LocationRecorder *)local_b8,&method->super_Message,OTHER);
          MethodDescriptorProto::set_client_streaming(method,true);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&location_1.location_,
                     "stream");
          bVar1 = Consume(this,stack0xffffffffffffff38);
          if (!bVar1) {
            this_local._7_1_ = 0;
          }
          local_7c = (uint)!bVar1;
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_b8);
          if (local_7c != 0) goto LAB_002c1872;
        }
        LocationRecorder::LocationRecorder((LocationRecorder *)local_e0,method_location,2);
        LocationRecorder::RecordLegacyLocation
                  ((LocationRecorder *)local_e0,&method->super_Message,INPUT_TYPE);
        psVar2 = MethodDescriptorProto::mutable_input_type_abi_cxx11_(method);
        bVar1 = ParseUserDefinedType(this,psVar2);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        local_7c = (uint)!bVar1;
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_e0);
        if (local_7c == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f0,")");
          bVar1 = Consume(this,local_f0);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_100,"returns");
            bVar1 = Consume(this,local_100);
            if (bVar1) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_110,"(");
              bVar1 = Consume(this,local_110);
              if (bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)&location_4.location_
                           ,"stream");
                bVar1 = LookingAt(this,stack0xfffffffffffffee0);
                if (bVar1) {
                  LocationRecorder::LocationRecorder
                            ((LocationRecorder *)local_138,method_location,6);
                  LocationRecorder::RecordLegacyLocation
                            ((LocationRecorder *)local_138,&method->super_Message,OTHER);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &location_3.location_,"stream");
                  bVar1 = Consume(this,stack0xfffffffffffffeb8);
                  if (bVar1) {
                    MethodDescriptorProto::set_server_streaming(method,true);
                  }
                  else {
                    this_local._7_1_ = 0;
                  }
                  local_7c = (uint)!bVar1;
                  LocationRecorder::~LocationRecorder((LocationRecorder *)local_138);
                  if (local_7c != 0) goto LAB_002c1872;
                }
                LocationRecorder::LocationRecorder((LocationRecorder *)local_160,method_location,3);
                LocationRecorder::RecordLegacyLocation
                          ((LocationRecorder *)local_160,&method->super_Message,OUTPUT_TYPE);
                psVar2 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(method);
                bVar1 = ParseUserDefinedType(this,psVar2);
                if (!bVar1) {
                  this_local._7_1_ = 0;
                }
                local_7c = (uint)!bVar1;
                LocationRecorder::~LocationRecorder((LocationRecorder *)local_160);
                if (local_7c == 0) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_170,")");
                  bVar1 = Consume(this,local_170);
                  if (bVar1) {
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_180,"{");
                    bVar1 = LookingAt(this,local_180);
                    if (bVar1) {
                      mutable_options = MethodDescriptorProto::mutable_options(method);
                      bVar1 = ParseMethodOptions(this,method_location,containing_file,4,
                                                 &mutable_options->super_Message);
                      if (!bVar1) {
                        this_local._7_1_ = 0;
                        goto LAB_002c1872;
                      }
                    }
                    else {
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (&local_190,";");
                      bVar1 = ConsumeEndOfDeclaration(this,local_190,method_location);
                      if (!bVar1) {
                        this_local._7_1_ = 0;
                        goto LAB_002c1872;
                      }
                    }
                    this_local._7_1_ = 1;
                  }
                  else {
                    this_local._7_1_ = 0;
                  }
                }
              }
              else {
                this_local._7_1_ = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_002c1872:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseServiceMethod(MethodDescriptorProto* method,
                                const LocationRecorder& method_location,
                                const FileDescriptorProto* containing_file) {
  DO(Consume("rpc"));

  {
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(method, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(method->mutable_name(), "Expected method name."));
  }

  // Parse input type.
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kClientStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      method->set_client_streaming(true);
      DO(Consume("stream"));
    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kInputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::INPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_input_type()));
  }
  DO(Consume(")"));

  // Parse output type.
  DO(Consume("returns"));
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kServerStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      DO(Consume("stream"));
      method->set_server_streaming(true);
    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kOutputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::OUTPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_output_type()));
  }
  DO(Consume(")"));

  if (LookingAt("{")) {
    // Options!
    DO(ParseMethodOptions(method_location, containing_file,
                          MethodDescriptorProto::kOptionsFieldNumber,
                          method->mutable_options()));
  } else {
    DO(ConsumeEndOfDeclaration(";", &method_location));
  }

  return true;
}